

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicsitem.cpp
# Opt level: O2

void QGraphicsObject::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QPointF *origin;
  qreal *pqVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  QGraphicsObject *pQVar5;
  code *UNRECOVERED_JUMPTABLE;
  QGraphicsItem *newParent;
  undefined4 uVar6;
  qreal qVar7;
  QPointF QVar8;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      parentChanged((QGraphicsObject *)_o);
      return;
    case 1:
      opacityChanged((QGraphicsObject *)_o);
      return;
    case 2:
      visibleChanged((QGraphicsObject *)_o);
      return;
    case 3:
      enabledChanged((QGraphicsObject *)_o);
      return;
    case 4:
      xChanged((QGraphicsObject *)_o);
      return;
    case 5:
      yChanged((QGraphicsObject *)_o);
      return;
    case 6:
      zChanged((QGraphicsObject *)_o);
      return;
    case 7:
      rotationChanged((QGraphicsObject *)_o);
      return;
    case 8:
      scaleChanged((QGraphicsObject *)_o);
      return;
    case 9:
      childrenChanged((QGraphicsObject *)_o);
      return;
    case 10:
      widthChanged((QGraphicsObject *)_o);
      return;
    case 0xb:
      heightChanged((QGraphicsObject *)_o);
      return;
    }
    break;
  case ReadProperty:
    if (0xd < (uint)_id) {
      return;
    }
    pqVar1 = (qreal *)*_a;
    switch(_id) {
    case 0:
      pQVar5 = QGraphicsItem::parentObject((QGraphicsItem *)(_o + 0x10));
      goto LAB_005808d9;
    case 1:
      qVar7 = *(qreal *)(*(long *)(_o + 0x18) + 0x80);
      break;
    case 2:
      bVar3 = *(byte *)(*(long *)(_o + 0x18) + 0x160) >> 7;
      goto LAB_005809b8;
    case 3:
      bVar3 = *(byte *)(*(long *)(_o + 0x18) + 0x160) >> 5 & 1;
LAB_005809b8:
      *(byte *)pqVar1 = bVar3;
      return;
    case 4:
      qVar7 = *(qreal *)(*(long *)(_o + 0x18) + 0x70);
      *pqVar1 = *(qreal *)(*(long *)(_o + 0x18) + 0x68);
      pqVar1[1] = qVar7;
      return;
    case 5:
      qVar7 = *(qreal *)(*(long *)(_o + 0x18) + 0x68);
      break;
    case 6:
      qVar7 = *(qreal *)(*(long *)(_o + 0x18) + 0x70);
      break;
    case 7:
      qVar7 = *(qreal *)(*(long *)(_o + 0x18) + 0x78);
      break;
    case 8:
      if (*(long *)(*(long *)(_o + 0x18) + 0xb0) == 0) {
        qVar7 = 0.0;
      }
      else {
        qVar7 = *(qreal *)(*(long *)(*(long *)(_o + 0x18) + 0xb0) + 0x58);
      }
      break;
    case 9:
      if (*(long *)(*(long *)(_o + 0x18) + 0xb0) == 0) {
        qVar7 = 1.0;
      }
      else {
        qVar7 = *(qreal *)(*(long *)(*(long *)(_o + 0x18) + 0xb0) + 0x50);
      }
      break;
    case 10:
      QVar8 = QGraphicsItem::transformOriginPoint((QGraphicsItem *)(_o + 0x10));
      *pqVar1 = QVar8.xp;
      pqVar1[1] = QVar8.yp;
      return;
    case 0xb:
      pQVar5 = *(QGraphicsObject **)(*(long *)(_o + 0x18) + 0xb8);
LAB_005808d9:
      *pqVar1 = (qreal)pQVar5;
      return;
    case 0xc:
      qVar7 = (qreal)(**(code **)(**(long **)(_o + 0x18) + 0x58))();
      break;
    case 0xd:
      qVar7 = (qreal)(**(code **)(**(long **)(_o + 0x18) + 0x70))();
    }
    *pqVar1 = qVar7;
    break;
  case WriteProperty:
    if ((uint)_id < 0xe) {
      origin = (QPointF *)*_a;
      switch(_id) {
      case 0:
        newParent = (QGraphicsItem *)((long)origin->xp + 0x10);
        if (origin->xp == 0.0) {
          newParent = (QGraphicsItem *)0x0;
        }
        QGraphicsItem::setParentItem((QGraphicsItem *)(_o + 0x10),newParent);
        return;
      case 1:
        QGraphicsItem::setOpacity((QGraphicsItem *)(_o + 0x10),origin->xp);
        return;
      case 2:
        QGraphicsItem::setEnabled((QGraphicsItem *)(_o + 0x10),*(bool *)&origin->xp);
        return;
      case 3:
        QGraphicsItem::setVisible((QGraphicsItem *)(_o + 0x10),*(bool *)&origin->xp);
        return;
      case 4:
        QGraphicsItem::setPos((QGraphicsItem *)(_o + 0x10),origin);
        return;
      case 5:
        QGraphicsItem::setX((QGraphicsItem *)(_o + 0x10),origin->xp);
        return;
      case 6:
        QGraphicsItem::setY((QGraphicsItem *)(_o + 0x10),origin->xp);
        return;
      case 7:
        QGraphicsItem::setZValue((QGraphicsItem *)(_o + 0x10),origin->xp);
        return;
      case 8:
        QGraphicsItem::setRotation((QGraphicsItem *)(_o + 0x10),origin->xp);
        return;
      case 9:
        QGraphicsItem::setScale((QGraphicsItem *)(_o + 0x10),origin->xp);
        return;
      case 10:
        QGraphicsItem::setTransformOriginPoint((QGraphicsItem *)(_o + 0x10),origin);
        return;
      case 0xb:
        QGraphicsItem::setGraphicsEffect((QGraphicsItem *)(_o + 0x10),(QGraphicsEffect *)origin->xp)
        ;
        return;
      case 0xc:
        uVar6 = SUB84(origin->xp,0);
        UNRECOVERED_JUMPTABLE = *(code **)(**(long **)(_o + 0x18) + 0x60);
        break;
      case 0xd:
        uVar6 = SUB84(origin->xp,0);
        UNRECOVERED_JUMPTABLE = *(code **)(**(long **)(_o + 0x18) + 0x78);
      }
      (*UNRECOVERED_JUMPTABLE)(uVar6);
      return;
    }
    break;
  case ResetProperty:
    if (_id == 0xd) {
      (**(code **)(**(long **)(_o + 0x18) + 0x80))();
      return;
    }
    if (_id == 0xc) {
      (**(code **)(**(long **)(_o + 0x18) + 0x68))();
      return;
    }
    break;
  case IndexOfMethod:
    bVar2 = QtMocHelpers::indexOfMethod<void(QGraphicsObject::*)()>
                      ((QtMocHelpers *)_a,(void **)parentChanged,0,0);
    if ((((((!bVar2) &&
           (bVar2 = QtMocHelpers::indexOfMethod<void(QGraphicsObject::*)()>
                              ((QtMocHelpers *)_a,(void **)opacityChanged,0,1), !bVar2)) &&
          (bVar2 = QtMocHelpers::indexOfMethod<void(QGraphicsObject::*)()>
                             ((QtMocHelpers *)_a,(void **)visibleChanged,0,2), !bVar2)) &&
         ((bVar2 = QtMocHelpers::indexOfMethod<void(QGraphicsObject::*)()>
                             ((QtMocHelpers *)_a,(void **)enabledChanged,0,3), !bVar2 &&
          (bVar2 = QtMocHelpers::indexOfMethod<void(QGraphicsObject::*)()>
                             ((QtMocHelpers *)_a,(void **)xChanged,0,4), !bVar2)))) &&
        ((bVar2 = QtMocHelpers::indexOfMethod<void(QGraphicsObject::*)()>
                            ((QtMocHelpers *)_a,(void **)yChanged,0,5), !bVar2 &&
         ((bVar2 = QtMocHelpers::indexOfMethod<void(QGraphicsObject::*)()>
                             ((QtMocHelpers *)_a,(void **)zChanged,0,6), !bVar2 &&
          (bVar2 = QtMocHelpers::indexOfMethod<void(QGraphicsObject::*)()>
                             ((QtMocHelpers *)_a,(void **)rotationChanged,0,7), !bVar2)))))) &&
       ((bVar2 = QtMocHelpers::indexOfMethod<void(QGraphicsObject::*)()>
                           ((QtMocHelpers *)_a,(void **)scaleChanged,0,8), !bVar2 &&
        ((bVar2 = QtMocHelpers::indexOfMethod<void(QGraphicsObject::*)()>
                            ((QtMocHelpers *)_a,(void **)childrenChanged,0,9), !bVar2 &&
         (bVar2 = QtMocHelpers::indexOfMethod<void(QGraphicsObject::*)()>
                            ((QtMocHelpers *)_a,(void **)widthChanged,0,10), !bVar2)))))) {
      QtMocHelpers::indexOfMethod<void(QGraphicsObject::*)()>
                ((QtMocHelpers *)_a,(void **)heightChanged,0,0xb);
      return;
    }
    break;
  case RegisterPropertyMetaType:
    if (_id == 0) {
      iVar4 = qMetaTypeId<QGraphicsObject*>();
      *(int *)*_a = iVar4;
    }
    else {
      *(undefined4 *)*_a = 0xffffffff;
    }
  }
  return;
}

Assistant:

void QGraphicsObject::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsObject *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->parentChanged(); break;
        case 1: _t->opacityChanged(); break;
        case 2: _t->visibleChanged(); break;
        case 3: _t->enabledChanged(); break;
        case 4: _t->xChanged(); break;
        case 5: _t->yChanged(); break;
        case 6: _t->zChanged(); break;
        case 7: _t->rotationChanged(); break;
        case 8: _t->scaleChanged(); break;
        case 9: _t->childrenChanged(); break;
        case 10: _t->widthChanged(); break;
        case 11: _t->heightChanged(); break;
        case 12: _t->updateMicroFocus(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGraphicsObject::*)()>(_a, &QGraphicsObject::parentChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsObject::*)()>(_a, &QGraphicsObject::opacityChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsObject::*)()>(_a, &QGraphicsObject::visibleChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsObject::*)()>(_a, &QGraphicsObject::enabledChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsObject::*)()>(_a, &QGraphicsObject::xChanged, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsObject::*)()>(_a, &QGraphicsObject::yChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsObject::*)()>(_a, &QGraphicsObject::zChanged, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsObject::*)()>(_a, &QGraphicsObject::rotationChanged, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsObject::*)()>(_a, &QGraphicsObject::scaleChanged, 8))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsObject::*)()>(_a, &QGraphicsObject::childrenChanged, 9))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsObject::*)()>(_a, &QGraphicsObject::widthChanged, 10))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsObject::*)()>(_a, &QGraphicsObject::heightChanged, 11))
            return;
    }
    if (_c == QMetaObject::RegisterPropertyMetaType) {
        switch (_id) {
        default: *reinterpret_cast<int*>(_a[0]) = -1; break;
        case 0:
            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< QGraphicsObject* >(); break;
        }
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QGraphicsObject**>(_v) = _t->parentObject(); break;
        case 1: *reinterpret_cast<qreal*>(_v) = _t->opacity(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->isEnabled(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->isVisible(); break;
        case 4: *reinterpret_cast<QPointF*>(_v) = _t->pos(); break;
        case 5: *reinterpret_cast<qreal*>(_v) = _t->x(); break;
        case 6: *reinterpret_cast<qreal*>(_v) = _t->y(); break;
        case 7: *reinterpret_cast<qreal*>(_v) = _t->zValue(); break;
        case 8: *reinterpret_cast<qreal*>(_v) = _t->rotation(); break;
        case 9: *reinterpret_cast<qreal*>(_v) = _t->scale(); break;
        case 10: *reinterpret_cast<QPointF*>(_v) = _t->transformOriginPoint(); break;
        case 11: *reinterpret_cast<QGraphicsEffect**>(_v) = _t->graphicsEffect(); break;
        case 12: *reinterpret_cast<qreal*>(_v) = _t->QGraphicsItem::d_func()->width(); break;
        case 13: *reinterpret_cast<qreal*>(_v) = _t->QGraphicsItem::d_func()->height(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setParentItem(*reinterpret_cast<QGraphicsObject**>(_v)); break;
        case 1: _t->setOpacity(*reinterpret_cast<qreal*>(_v)); break;
        case 2: _t->setEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setVisible(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setPos(*reinterpret_cast<QPointF*>(_v)); break;
        case 5: _t->setX(*reinterpret_cast<qreal*>(_v)); break;
        case 6: _t->setY(*reinterpret_cast<qreal*>(_v)); break;
        case 7: _t->setZValue(*reinterpret_cast<qreal*>(_v)); break;
        case 8: _t->setRotation(*reinterpret_cast<qreal*>(_v)); break;
        case 9: _t->setScale(*reinterpret_cast<qreal*>(_v)); break;
        case 10: _t->setTransformOriginPoint(*reinterpret_cast<QPointF*>(_v)); break;
        case 11: _t->setGraphicsEffect(*reinterpret_cast<QGraphicsEffect**>(_v)); break;
        case 12: _t->QGraphicsItem::d_func()->setWidth(*reinterpret_cast<qreal*>(_v)); break;
        case 13: _t->QGraphicsItem::d_func()->setHeight(*reinterpret_cast<qreal*>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 12: _t->QGraphicsItem::d_func()->resetWidth(); break;
        case 13: _t->QGraphicsItem::d_func()->resetHeight(); break;
        default: break;
        }
    }
}